

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O3

bignum_t<10> __thiscall bignum_t<10>::operator-(bignum_t<10> *this)

{
  bignum_t<10> bVar1;
  bignum_t<10> result;
  undefined2 local_18;
  undefined2 uStack_16;
  byte bStack_14;
  undefined5 uStack_13;
  
  local_18 = 10;
  bStack_14 = 0;
  CVmObjBigNum::copy_val((char *)&local_18,this->ext,1);
  if ((bStack_14 & 8) == 0) {
    bStack_14 = bStack_14 ^ 1;
  }
  bVar1.ext[0] = (undefined1)local_18;
  bVar1.ext[1] = local_18._1_1_;
  bVar1.ext[2] = (undefined1)uStack_16;
  bVar1.ext[3] = uStack_16._1_1_;
  bVar1.ext[4] = bStack_14;
  bVar1.ext[5] = (undefined1)uStack_13;
  bVar1.ext[6] = uStack_13._1_1_;
  bVar1.ext[7] = uStack_13._2_1_;
  bVar1.ext[8] = uStack_13._3_1_;
  bVar1.ext[9] = uStack_13._4_1_;
  return (bignum_t<10>)bVar1.ext;
}

Assistant:

bignum_t<prec> operator -()
    {
        bignum_t<prec> result(this);
        CVmObjBigNum::negate(result.ext);
        return result;
    }